

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testInit
          (VaryingLocationAliasingWithMixedTypesTest *this)

{
  GLuint GVar1;
  GLuint *pGVar2;
  Type TVar3;
  undefined1 local_148 [8];
  testCase test_case_out_1;
  testCase test_case_in_1;
  GLuint goten_1;
  testCase test_case_out;
  testCase test_case_in;
  GLuint goten;
  GLuint goten_upper_limit;
  GLuint local_94;
  GLuint goten_lower_limit;
  GLint last_aliasing;
  GLint first_aliasing;
  GLuint gohan;
  GLuint stage;
  GLuint valid_component_goten;
  GLuint valid_component_gohan;
  GLuint n_req_components_goten;
  GLuint n_req_components_gohan;
  GLuint GStack_6c;
  bool is_float_type_goten;
  GLuint local_68;
  Type local_5c;
  Type *local_50;
  Type *type_goten;
  GLuint j;
  GLuint GStack_3c;
  bool is_float_type_gohan;
  GLuint local_38;
  Type local_2c;
  Type *local_20;
  Type *type_gohan;
  GLuint i;
  GLuint n_types;
  VaryingLocationAliasingWithMixedTypesTest *this_local;
  
  _i = this;
  type_gohan._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type_gohan._0_4_ = 0; (uint)type_gohan < type_gohan._4_4_;
      type_gohan._0_4_ = (uint)type_gohan + 1) {
    TVar3 = TestBase::getType((TestBase *)this,(uint)type_gohan);
    _j = TVar3._0_8_;
    local_2c.m_basic_type = j;
    local_2c.m_n_columns = GStack_3c;
    local_38 = TVar3.m_n_rows;
    local_2c.m_n_rows = local_38;
    local_20 = &local_2c;
    _j = TVar3;
    type_goten._7_1_ = isFloatType(this,local_20);
    if (local_20->m_n_columns == 1) {
      for (type_goten._0_4_ = 0; (uint)type_goten < type_gohan._4_4_;
          type_goten._0_4_ = (uint)type_goten + 1) {
        TVar3 = TestBase::getType((TestBase *)this,(uint)type_goten);
        _n_req_components_gohan = TVar3._0_8_;
        local_5c.m_basic_type = n_req_components_gohan;
        local_5c.m_n_columns = GStack_6c;
        local_68 = TVar3.m_n_rows;
        local_5c.m_n_rows = local_68;
        local_50 = &local_5c;
        _n_req_components_gohan = TVar3;
        n_req_components_goten._3_1_ = isFloatType(this,local_50);
        if ((local_50->m_n_columns == 1) && ((type_goten._7_1_ & 1) != n_req_components_goten._3_1_)
           ) {
          valid_component_gohan = local_20->m_n_rows;
          valid_component_goten = local_50->m_n_rows;
          stage = 4 - valid_component_gohan;
          gohan = 4 - valid_component_goten;
          if (valid_component_gohan + valid_component_goten < 5) {
            for (first_aliasing = 0; (uint)first_aliasing < 6; first_aliasing = first_aliasing + 1)
            {
              if (first_aliasing != 0) {
                for (last_aliasing = 0; (uint)last_aliasing <= stage;
                    last_aliasing = last_aliasing + 1) {
                  goten_lower_limit = (last_aliasing - valid_component_goten) + 1;
                  local_94 = (last_aliasing + valid_component_gohan) - 1;
                  goten = 0;
                  pGVar2 = (GLuint *)std::max<int>((int *)&goten,(int *)&goten_lower_limit);
                  GVar1 = local_94;
                  goten_upper_limit = *pGVar2;
                  for (test_case_in.m_type_goten.m_n_columns = 0;
                      test_case_in.m_type_goten.m_n_columns < goten_upper_limit;
                      test_case_in.m_type_goten.m_n_columns =
                           test_case_in.m_type_goten.m_n_columns + 1) {
                    test_case_out.m_type_goten.m_n_columns = last_aliasing;
                    test_case_out.m_type_goten.m_n_rows = test_case_in.m_type_goten.m_n_columns;
                    test_case_in_1.m_type_goten.m_n_rows = last_aliasing;
                    test_case_out.m_component_gohan._0_1_ = 0;
                    test_case_out.m_component_goten = first_aliasing;
                    test_case_out._8_8_ = *(undefined8 *)local_20;
                    test_case_out.m_type_gohan.m_basic_type = local_20->m_n_rows;
                    test_case_out.m_type_gohan.m_n_columns = local_50->m_basic_type;
                    test_case_out.m_type_gohan.m_n_rows = local_50->m_n_columns;
                    test_case_out.m_type_goten.m_basic_type = local_50->m_n_rows;
                    std::
                    vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                    ::push_back(&this->m_test_cases,
                                (value_type *)&test_case_out.m_type_goten.m_n_columns);
                    if ((first_aliasing != 5) ||
                       ((local_20->m_basic_type != Double && (local_50->m_basic_type != Double)))) {
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                      ::push_back(&this->m_test_cases,
                                  (value_type *)&test_case_in_1.m_type_goten.m_n_rows);
                    }
                  }
                  while (test_case_in_1.m_type_goten.m_n_columns = GVar1 + 1,
                        test_case_in_1.m_type_goten.m_n_columns <= gohan) {
                    test_case_out_1.m_type_goten.m_n_columns = last_aliasing;
                    test_case_out_1.m_type_goten.m_n_rows = test_case_in_1.m_type_goten.m_n_columns;
                    test_case_in_1.m_component_gohan._0_1_ = 1;
                    test_case_in_1.m_component_goten = first_aliasing;
                    test_case_in_1._8_8_ = *(undefined8 *)local_20;
                    test_case_in_1.m_type_gohan.m_basic_type = local_20->m_n_rows;
                    test_case_in_1.m_type_gohan.m_n_columns = local_50->m_basic_type;
                    test_case_in_1.m_type_gohan.m_n_rows = local_50->m_n_columns;
                    test_case_in_1.m_type_goten.m_basic_type = local_50->m_n_rows;
                    local_148._0_4_ = last_aliasing;
                    local_148._4_4_ = test_case_in_1.m_type_goten.m_n_columns;
                    test_case_out_1.m_component_gohan._0_1_ = 0;
                    test_case_out_1.m_component_goten = first_aliasing;
                    test_case_out_1._8_8_ = *(undefined8 *)local_20;
                    test_case_out_1.m_type_gohan.m_basic_type = local_20->m_n_rows;
                    test_case_out_1.m_type_gohan.m_n_columns = local_50->m_basic_type;
                    test_case_out_1.m_type_gohan.m_n_rows = local_50->m_n_columns;
                    test_case_out_1.m_type_goten.m_basic_type = local_50->m_n_rows;
                    std::
                    vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                    ::push_back(&this->m_test_cases,
                                (value_type *)&test_case_out_1.m_type_goten.m_n_columns);
                    if ((first_aliasing != 5) ||
                       ((GVar1 = test_case_in_1.m_type_goten.m_n_columns,
                        local_20->m_basic_type != Double && (local_50->m_basic_type != Double)))) {
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                      ::push_back(&this->m_test_cases,(value_type *)local_148);
                      GVar1 = test_case_in_1.m_type_goten.m_n_columns;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedTypesTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip valid combinations */
			if (is_float_type_gohan == is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;
			const GLuint valid_component_gohan  = n_components_per_location - n_req_components_gohan;
			const GLuint valid_component_goten  = n_components_per_location - n_req_components_goten;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				for (GLuint gohan = 0; gohan <= valid_component_gohan; ++gohan)
				{
					const GLint first_aliasing = gohan - n_req_components_goten + 1;
					const GLint last_aliasing  = gohan + n_req_components_gohan - 1;

					const GLuint goten_lower_limit = std::max(0, first_aliasing);
					const GLuint goten_upper_limit = last_aliasing + 1;

					/* Compoennets before gohan */
					for (GLuint goten = 0; goten < goten_lower_limit; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}

					/* Components after gohan */
					for (GLuint goten = goten_upper_limit; goten <= valid_component_goten; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}